

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  string_view x;
  FILE *pFVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  FILE *__stream;
  size_t sVar7;
  uchar *__ptr;
  long size;
  FILE *infile;
  stat statbuf;
  string_view local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  char *local_58;
  char *local_50;
  char *filename_cstr;
  string filename_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  string_view filename_local;
  
  filename_str.field_2._8_8_ = filename.size_;
  filename_local.data_ = filename.data_;
  out_data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  string_view::to_string_abi_cxx11_((string *)&filename_cstr,(string_view *)&out_data_local);
  local_50 = (char *)std::__cxx11::string::c_str();
  local_60 = out_data_local;
  local_58 = filename_local.data_;
  string_view::string_view(&local_70,"-");
  x.size_ = (size_type)local_58;
  x.data_ = (char *)local_60;
  bVar3 = operator==(x,local_70);
  if (bVar3) {
    filename_local.size_._4_4_ =
         ReadStdin((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   filename_str.field_2._8_8_);
  }
  else {
    iVar4 = stat(local_50,(stat *)&infile);
    pcVar2 = local_50;
    pFVar1 = _stderr;
    if (iVar4 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"%s: %s\n",pcVar2,pcVar6);
      Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
    }
    else if (((uint)statbuf.st_nlink & 0x8000) == 0) {
      fprintf(_stderr,"%s: not a regular file\n",local_50);
      Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
    }
    else {
      __stream = fopen(local_50,"rb");
      pcVar2 = local_50;
      pFVar1 = _stderr;
      if (__stream == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"%s: %s\n",pcVar2,pcVar6);
        Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
      }
      else {
        iVar4 = fseek(__stream,0,2);
        if (iVar4 < 0) {
          perror("fseek to end failed");
          fclose(__stream);
          Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
        }
        else {
          sVar7 = ftell(__stream);
          if ((long)sVar7 < 0) {
            perror("ftell failed");
            fclose(__stream);
            Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
          }
          else {
            iVar4 = fseek(__stream,0,0);
            if (iVar4 < 0) {
              perror("fseek to beginning failed");
              fclose(__stream);
              Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
            }
            else {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         filename_str.field_2._8_8_,sVar7);
              if (sVar7 != 0) {
                __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   filename_str.field_2._8_8_);
                sVar7 = fread(__ptr,sVar7,1,__stream);
                pcVar2 = local_50;
                pFVar1 = _stderr;
                if (sVar7 != 1) {
                  piVar5 = __errno_location();
                  pcVar6 = strerror(*piVar5);
                  fprintf(pFVar1,"%s: fread failed: %s\n",pcVar2,pcVar6);
                  fclose(__stream);
                  Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
                  goto LAB_002488a6;
                }
              }
              fclose(__stream);
              Result::Result((Result *)((long)&filename_local.size_ + 4),Ok);
            }
          }
        }
      }
    }
  }
LAB_002488a6:
  statbuf.__glibc_reserved[2]._4_4_ = 1;
  std::__cxx11::string::~string((string *)&filename_cstr);
  return (Result)filename_local.size_._4_4_;
}

Assistant:

Result ReadFile(string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str = filename.to_string();
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadStdin(out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (!(statbuf.st_mode & S_IFREG)) {
    fprintf(stderr, "%s: not a regular file\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    perror("fseek to end failed");
    fclose(infile);
    return Result::Error;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}